

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O2

bool __thiscall cmCTestVC::WriteXML(cmCTestVC *this,cmXMLWriter *xml)

{
  int iVar1;
  
  std::operator<<(this->Log,"--- Begin Revisions ---\n");
  iVar1 = (*this->_vptr_cmCTestVC[6])(this,xml);
  std::operator<<(this->Log,"--- End Revisions ---\n");
  return SUB41(iVar1,0);
}

Assistant:

bool cmCTestVC::WriteXML(cmXMLWriter& xml)
{
  this->Log << "--- Begin Revisions ---\n";
  bool result = this->WriteXMLUpdates(xml);
  this->Log << "--- End Revisions ---\n";
  return result;
}